

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_getcBlockSize(void *src,size_t srcSize,blockProperties_t *bpPtr)

{
  U32 UVar1;
  U32 cSize;
  U32 cBlockHeader;
  blockProperties_t *bpPtr_local;
  size_t srcSize_local;
  void *src_local;
  
  if (srcSize < 3) {
    src_local = (void *)0xffffffffffffffb8;
  }
  else {
    UVar1 = MEM_readLE24(src);
    bpPtr->lastBlock = UVar1 & 1;
    bpPtr->blockType = UVar1 >> 1 & bt_reserved;
    bpPtr->origSize = UVar1 >> 3;
    if (bpPtr->blockType == bt_rle) {
      src_local = (void *)0x1;
    }
    else if (bpPtr->blockType == bt_reserved) {
      src_local = (void *)0xffffffffffffffec;
    }
    else {
      src_local = (void *)(ulong)(UVar1 >> 3);
    }
  }
  return (size_t)src_local;
}

Assistant:

size_t ZSTD_getcBlockSize(const void* src, size_t srcSize,
                          blockProperties_t* bpPtr)
{
    RETURN_ERROR_IF(srcSize < ZSTD_blockHeaderSize, srcSize_wrong);

    {   U32 const cBlockHeader = MEM_readLE24(src);
        U32 const cSize = cBlockHeader >> 3;
        bpPtr->lastBlock = cBlockHeader & 1;
        bpPtr->blockType = (blockType_e)((cBlockHeader >> 1) & 3);
        bpPtr->origSize = cSize;   /* only useful for RLE */
        if (bpPtr->blockType == bt_rle) return 1;
        RETURN_ERROR_IF(bpPtr->blockType == bt_reserved, corruption_detected);
        return cSize;
    }
}